

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Type> *
wasm::WATParser::maybeReftype<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  bool bVar1;
  bool bVar2;
  TypeT TVar3;
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
  *p_Var4;
  HeapTypeT HVar5;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string_view expected_14;
  string_view expected_15;
  undefined1 local_c0 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> type;
  string local_78 [32];
  undefined1 local_58 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> _val;
  
  this = &ctx->in;
  expected._M_str = "funcref";
  expected._M_len = 7;
  bVar1 = Lexer::takeKeyword(this,expected);
  if (bVar1) {
    HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeFuncType
                      (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,Unshared);
  }
  else {
    expected_00._M_str = "externref";
    expected_00._M_len = 9;
    bVar1 = Lexer::takeKeyword(this,expected_00);
    if (bVar1) {
      HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExternType
                        (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,Unshared);
    }
    else {
      expected_01._M_str = "anyref";
      expected_01._M_len = 6;
      bVar1 = Lexer::takeKeyword(this,expected_01);
      if (bVar1) {
        HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeAnyType
                          (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,Unshared)
        ;
      }
      else {
        expected_02._M_str = "eqref";
        expected_02._M_len = 5;
        bVar1 = Lexer::takeKeyword(this,expected_02);
        if (bVar1) {
          HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeEqType
                            (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                             Unshared);
        }
        else {
          expected_03._M_str = "i31ref";
          expected_03._M_len = 6;
          bVar1 = Lexer::takeKeyword(this,expected_03);
          if (bVar1) {
            HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeI31Type
                              (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                               Unshared);
          }
          else {
            expected_04._M_str = "structref";
            expected_04._M_len = 9;
            bVar1 = Lexer::takeKeyword(this,expected_04);
            if (bVar1) {
              HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStructType
                                (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                 Unshared);
            }
            else {
              expected_05._M_str = "arrayref";
              expected_05._M_len = 8;
              bVar1 = Lexer::takeKeyword(this,expected_05);
              if (bVar1) {
                HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeArrayType
                                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                   Unshared);
              }
              else {
                expected_06._M_str = "exnref";
                expected_06._M_len = 6;
                bVar1 = Lexer::takeKeyword(this,expected_06);
                if (bVar1) {
                  HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExnType
                                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                     ,Unshared);
                }
                else {
                  expected_07._M_str = "stringref";
                  expected_07._M_len = 9;
                  bVar1 = Lexer::takeKeyword(this,expected_07);
                  if (bVar1) {
                    HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStringType
                                      (&ctx->
                                        super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                       Unshared);
                  }
                  else {
                    expected_08._M_str = "contref";
                    expected_08._M_len = 7;
                    bVar1 = Lexer::takeKeyword(this,expected_08);
                    if (bVar1) {
                      HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeContType
                                        (&ctx->
                                          super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                         Unshared);
                    }
                    else {
                      expected_09._M_str = "nullref";
                      expected_09._M_len = 7;
                      bVar1 = Lexer::takeKeyword(this,expected_09);
                      if (bVar1) {
                        HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoneType
                                          (&ctx->
                                            super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                           ,Unshared);
                      }
                      else {
                        expected_10._M_str = "nullexternref";
                        expected_10._M_len = 0xd;
                        bVar1 = Lexer::takeKeyword(this,expected_10);
                        if (bVar1) {
                          HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoextType
                                            (&ctx->
                                              super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                             ,Unshared);
                        }
                        else {
                          expected_11._M_str = "nullfuncref";
                          expected_11._M_len = 0xb;
                          bVar1 = Lexer::takeKeyword(this,expected_11);
                          if (bVar1) {
                            HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                    makeNofuncType(&ctx->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,Unshared);
                          }
                          else {
                            expected_12._M_str = "nullexnref";
                            expected_12._M_len = 10;
                            bVar1 = Lexer::takeKeyword(this,expected_12);
                            if (bVar1) {
                              HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                      makeNoexnType(&ctx->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,Unshared);
                            }
                            else {
                              expected_13._M_str = "nullcontref";
                              expected_13._M_len = 0xb;
                              bVar1 = Lexer::takeKeyword(this,expected_13);
                              if (!bVar1) {
                                expected_14._M_str = "ref";
                                expected_14._M_len = 3;
                                bVar1 = Lexer::takeSExprStart(this,expected_14);
                                if (bVar1) {
                                  expected_15._M_str = "null";
                                  expected_15._M_len = 4;
                                  bVar1 = Lexer::takeKeyword(this,expected_15);
                                  heaptype<wasm::WATParser::ParseModuleTypesCtx>
                                            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                              *)local_c0,ctx);
                                  std::__detail::__variant::
                                  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                  ::_Copy_ctor_base((
                                                  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_58,
                                                  (
                                                  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_c0);
                                  if (_val.val.
                                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                      .
                                      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                      ._M_u._24_1_ == '\x01') {
                                    std::__cxx11::string::string(local_78,(string *)local_58);
                                    std::__detail::__variant::
                                    _Variant_storage<false,wasm::Type,wasm::None,wasm::Err>::
                                    _Variant_storage<2ul,wasm::Err>
                                              ((_Variant_storage<false,wasm::Type,wasm::None,wasm::Err>
                                                *)__return_storage_ptr__,local_78);
                                    std::__cxx11::string::~string(local_78);
                                    std::__detail::__variant::
                                    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                    ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_58);
                                  }
                                  else {
                                    std::__detail::__variant::
                                    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                    ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_58);
                                    bVar2 = Lexer::takeRParen(this);
                                    if (bVar2) {
                                      p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                *)0x0;
                                      if (type.val.
                                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                          ._M_u._24_1_ == '\0') {
                                        p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_c0;
                                      }
                                      HVar5.exactness =
                                           *(undefined4 *)
                                            ((long)&(p_Var4->
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  )._M_u + 8);
                                      HVar5.type.id = (uintptr_t)local_c0;
                                      HVar5._12_4_ = 0;
                                      TVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                              makeRefType(&ctx->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,HVar5,(uint)bVar1);
                                      *(uintptr_t *)
                                       &(__return_storage_ptr__->val).
                                        super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           = TVar3.id;
                                      *(__index_type *)
                                       ((long)&(__return_storage_ptr__->val).
                                               super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                       + 0x20) = '\0';
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)
                                                 ((long)&type.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 + 0x20),"expected end of reftype",
                                                 (allocator<char> *)local_78);
                                      Lexer::err((Err *)local_58,this,
                                                 (string *)
                                                 ((long)&type.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 + 0x20));
                                      std::__detail::__variant::
                                      _Variant_storage<false,wasm::Type,wasm::None,wasm::Err>::
                                      _Variant_storage<2ul,wasm::Err>
                                                ((_Variant_storage<false,wasm::Type,wasm::None,wasm::Err>
                                                  *)__return_storage_ptr__,local_58);
                                      std::__cxx11::string::~string((string *)local_58);
                                      std::__cxx11::string::~string
                                                ((string *)
                                                 ((long)&type.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 + 0x20));
                                    }
                                  }
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  *)local_c0);
                                  return __return_storage_ptr__;
                                }
                                *(__index_type *)
                                 ((long)&(__return_storage_ptr__->val).
                                         super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                         .super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                 + 0x20) = '\x01';
                                return __return_storage_ptr__;
                              }
                              HVar5 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                      makeNocontType(&ctx->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,Unshared);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  TVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,HVar5,Nullable)
  ;
  *(uintptr_t *)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> = TVar3.id;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> maybeReftype(Ctx& ctx) {
  if (ctx.in.takeKeyword("funcref"sv)) {
    return ctx.makeRefType(ctx.makeFuncType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("externref"sv)) {
    return ctx.makeRefType(ctx.makeExternType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("anyref"sv)) {
    return ctx.makeRefType(ctx.makeAnyType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("eqref"sv)) {
    return ctx.makeRefType(ctx.makeEqType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("i31ref"sv)) {
    return ctx.makeRefType(ctx.makeI31Type(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("structref"sv)) {
    return ctx.makeRefType(ctx.makeStructType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("arrayref"sv)) {
    return ctx.makeRefType(ctx.makeArrayType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("exnref"sv)) {
    return ctx.makeRefType(ctx.makeExnType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("stringref"sv)) {
    return ctx.makeRefType(ctx.makeStringType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("contref"sv)) {
    return ctx.makeRefType(ctx.makeContType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullref"sv)) {
    return ctx.makeRefType(ctx.makeNoneType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullexternref"sv)) {
    return ctx.makeRefType(ctx.makeNoextType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullfuncref"sv)) {
    return ctx.makeRefType(ctx.makeNofuncType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullexnref"sv)) {
    return ctx.makeRefType(ctx.makeNoexnType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullcontref"sv)) {
    return ctx.makeRefType(ctx.makeNocontType(Unshared), Nullable);
  }

  if (!ctx.in.takeSExprStart("ref"sv)) {
    return {};
  }

  auto nullability = ctx.in.takeKeyword("null"sv) ? Nullable : NonNullable;

  auto type = heaptype(ctx);
  CHECK_ERR(type);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of reftype");
  }

  return ctx.makeRefType(*type, nullability);
}